

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O0

void fs_event_cb_close(uv_fs_event_t *handle,char *filename,int events,int status)

{
  int status_local;
  int events_local;
  char *filename_local;
  uv_fs_event_t *handle_local;
  
  if (status != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
            ,0x19d,"status == 0");
    abort();
  }
  if (2 < fs_event_cb_called) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
            ,0x19f,"fs_event_cb_called < 3");
    abort();
  }
  fs_event_cb_called = fs_event_cb_called + 1;
  if (fs_event_cb_called == 3) {
    uv_close(handle,close_cb);
  }
  return;
}

Assistant:

static void fs_event_cb_close(uv_fs_event_t* handle,
                              const char* filename,
                              int events,
                              int status) {
  ASSERT(status == 0);

  ASSERT(fs_event_cb_called < 3);
  ++fs_event_cb_called;

  if (fs_event_cb_called == 3) {
    uv_close((uv_handle_t*) handle, close_cb);
  }
}